

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_reverse(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t l;
  luaL_Buffer b;
  size_t local_2040;
  luaL_Buffer local_2038;
  
  pcVar1 = luaL_checklstring(L,1,&local_2040);
  pcVar2 = luaL_buffinitsize(L,&local_2038,local_2040);
  if (local_2040 == 0) {
    local_2040 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar1 = pcVar1 + -1;
      pcVar2[uVar3] = pcVar1[local_2040];
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_2040);
  }
  luaL_pushresultsize(&local_2038,local_2040);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l, i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i = 0; i < l; i++)
    p[i] = s[l - i - 1];
  luaL_pushresultsize(&b, l);
  return 1;
}